

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O2

char * Fverb::parameter_short_label(uint index)

{
  char *pcVar1;
  
  pcVar1 = (char *)0x0;
  if (index < 0xb) {
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

const char *Fverb::parameter_short_label(unsigned index) noexcept
{
    switch (index) {

    case 0:
        return "";

    case 1:
        return "";

    case 2:
        return "";

    case 3:
        return "";

    case 4:
        return "";

    case 5:
        return "";

    case 6:
        return "";

    case 7:
        return "";

    case 8:
        return "";

    case 9:
        return "";

    case 10:
        return "";

    default:
        return 0;
    }
}